

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O0

field<discordpp::User> * __thiscall
discordpp::field<discordpp::User>::operator=(field<discordpp::User> *this,field<discordpp::User> *f)

{
  bool bVar1;
  type pUVar2;
  pointer local_58;
  field<discordpp::User> *f_local;
  field<discordpp::User> *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)f);
  if (bVar1) {
    local_58 = (pointer)operator_new(0x150);
    pUVar2 = std::unique_ptr<discordpp::User,_std::default_delete<discordpp::User>_>::operator*
                       (&f->t_);
    User::User(local_58,pUVar2);
  }
  else {
    local_58 = (pointer)0x0;
  }
  std::unique_ptr<discordpp::User,_std::default_delete<discordpp::User>_>::reset(&this->t_,local_58)
  ;
  this->s_ = present_e;
  return this;
}

Assistant:

field<T> &operator=(const field<T> &f) {
        t_.reset(f.t_ ? new T(*f.t_) : nullptr);
        s_ = present_e;
        return *this;
    }